

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

bool deranged_check(int a)

{
  if (a < 1) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"DERANGED_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  A < 1.\n");
  }
  return 0 < a;
}

Assistant:

bool deranged_check ( int a )

//****************************************************************************80
//
//  Purpose:
//
//    DERANGED_CHECK checks the parameter of the Deranged PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, the total number of items.
//    1 <= A.
//
//    Output, bool DERANGED_CHECK, is true if the parameters are legal.
//
{
  if ( a < 1 )
  {
    cerr << " \n";
    cerr << "DERANGED_CHECK - Warning!\n";
    cerr << "  A < 1.\n";
    return false;
  }

  return true;
}